

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::ReadFloat3Tuple_Ascii<aiColor3D>(COBImporter *this,aiColor3D *fill,char **in)

{
  char cVar1;
  char *c;
  aiColor3D *paVar2;
  int iVar3;
  float local_2c;
  
  c = *in;
  iVar3 = 0;
  while( true ) {
    for (; (cVar1 = *c, cVar1 == '\t' || (cVar1 == ' ')); c = c + 1) {
    }
    if (cVar1 != ',') goto LAB_004c76b8;
    do {
      c = c + 1;
LAB_004c76b8:
    } while ((*c == ' ') || (*c == '\t'));
    local_2c = 0.0;
    c = fast_atoreal_move<float>(c,&local_2c,true);
    paVar2 = (aiColor3D *)&fill->g;
    if ((iVar3 != 1) && (paVar2 = fill, iVar3 == 2)) break;
    paVar2->r = local_2c;
    iVar3 = iVar3 + 1;
  }
  fill->b = local_2c;
  *in = c;
  return;
}

Assistant:

void COBImporter::ReadFloat3Tuple_Ascii(T& fill, const char** in)
{
    const char* rgb = *in;
    for(unsigned int i = 0; i < 3; ++i) {
        SkipSpaces(&rgb);
        if (*rgb == ',')++rgb;
        SkipSpaces(&rgb);

        fill[i] = fast_atof(&rgb);
    }
    *in = rgb;
}